

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiMesh * __thiscall
Assimp::FBX::FBXConverter::SetupEmptyMesh(FBXConverter *this,Geometry *mesh,aiNode *nd)

{
  uint uVar1;
  bool bVar2;
  aiMesh *paVar3;
  mapped_type *this_00;
  ulong __n;
  aiMesh *out_mesh;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  paVar3 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar3);
  out_mesh = paVar3;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this->meshes,&out_mesh);
  name._M_dataplus._M_p = (pointer)mesh;
  this_00 = std::
            map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->meshes_converted,(key_type *)&name);
  local_48._M_dataplus._M_p._0_4_ =
       (int)((ulong)((long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,(uint *)&local_48);
  std::__cxx11::string::string((string *)&name,(string *)&(mesh->super_Object).name);
  std::__cxx11::string::substr((ulong)&local_48,(ulong)&name);
  bVar2 = std::operator==(&local_48,"Geometry::");
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  paVar3 = out_mesh;
  if (name._M_string_length == 0) {
    if ((aiNode *)&out_mesh->mName == nd) goto LAB_0050a647;
    uVar1 = (nd->mName).length;
    __n = (ulong)uVar1;
    (out_mesh->mName).length = uVar1;
    memcpy((out_mesh->mName).data,(nd->mName).data,__n);
  }
  else {
    if (0x3ff < name._M_string_length) goto LAB_0050a647;
    (out_mesh->mName).length = (ai_uint32)name._M_string_length;
    memcpy((out_mesh->mName).data,name._M_dataplus._M_p,name._M_string_length);
    __n = name._M_string_length;
  }
  (paVar3->mName).data[__n] = '\0';
LAB_0050a647:
  paVar3 = out_mesh;
  std::__cxx11::string::~string((string *)&name);
  return paVar3;
}

Assistant:

aiMesh* FBXConverter::SetupEmptyMesh(const Geometry& mesh, aiNode& nd)
        {
            aiMesh* const out_mesh = new aiMesh();
            meshes.push_back(out_mesh);
            meshes_converted[&mesh].push_back(static_cast<unsigned int>(meshes.size() - 1));

            // set name
            std::string name = mesh.Name();
            if (name.substr(0, 10) == "Geometry::") {
                name = name.substr(10);
            }

            if (name.length()) {
                out_mesh->mName.Set(name);
            }
            else
            {
                out_mesh->mName = nd.mName;
            }

            return out_mesh;
        }